

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::initializePipelineStack(QPDFWriter *this,Pipeline *p)

{
  Count *this_00;
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<Pipeline> local_38 [2];
  Pipeline *local_18;
  Pipeline *p_local;
  QPDFWriter *this_local;
  
  local_18 = p;
  p_local = (Pipeline *)this;
  this_00 = (Count *)operator_new(0x58);
  ::qpdf::pl::Count::Count(this_00,1,local_18);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar1->pipeline = this_00;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::shared_ptr<qpdf::pl::Count,void>(local_38,peVar2->pipeline);
  std::__cxx11::list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>>::
  emplace_back<std::shared_ptr<Pipeline>>
            ((list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>> *)
             &peVar1->to_delete,local_38);
  std::shared_ptr<Pipeline>::~shared_ptr(local_38);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar1->pipeline_stack,
             &peVar2->pipeline);
  return;
}

Assistant:

void
QPDFWriter::initializePipelineStack(Pipeline* p)
{
    m->pipeline = new pl::Count(1, p);
    m->to_delete.emplace_back(std::shared_ptr<Pipeline>(m->pipeline));
    m->pipeline_stack.emplace_back(m->pipeline);
}